

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,int>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
                    *handler)

{
  wchar_t wVar1;
  basic_string_view<wchar_t> id;
  bool bVar2;
  type count;
  id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
  *in_RDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  wchar_t *it;
  uint index;
  wchar_t c;
  char *in_stack_ffffffffffffffa8;
  id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
  *in_stack_ffffffffffffffb0;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar3;
  wchar_t *in_stack_ffffffffffffffc0;
  wchar_t **in_stack_ffffffffffffffc8;
  wchar_t *local_30;
  wchar_t *local_8;
  
  wVar1 = *in_RDI;
  local_8 = in_RDI;
  if ((wVar1 == L'}') || (wVar1 == L':')) {
    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
    ::operator()((id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
                  *)0x254c86);
  }
  else if ((wVar1 < L'0') || (L'9' < wVar1)) {
    bVar2 = is_name_start<wchar_t>(wVar1);
    local_30 = in_RDI;
    if (bVar2) {
      do {
        local_30 = local_30 + 1;
        uVar3 = false;
        if (local_30 != in_RSI) {
          wVar1 = *local_30;
          bVar2 = is_name_start<wchar_t>(wVar1);
          in_stack_ffffffffffffffbe = true;
          uVar3 = true;
          if (!bVar2) {
            in_stack_ffffffffffffffbd = L'/' < wVar1 && wVar1 < L':';
            in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbd;
            uVar3 = in_stack_ffffffffffffffbd;
          }
        }
      } while ((bool)uVar3 != false);
      count = to_unsigned<long>((long)local_30 - (long)in_RDI >> 2);
      basic_string_view<wchar_t>::basic_string_view
                ((basic_string_view<wchar_t> *)&stack0xffffffffffffffc0,in_RDI,count);
      id.data_._5_1_ = in_stack_ffffffffffffffbd;
      id.data_._0_5_ = in_stack_ffffffffffffffb8;
      id.data_._6_1_ = in_stack_ffffffffffffffbe;
      id.data_._7_1_ = uVar3;
      id.size_ = (size_t)in_stack_ffffffffffffffc0;
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
      ::operator()(in_RDX,id);
      local_8 = local_30;
    }
    else {
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else {
    parse_nonnegative_int<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,int>&,wchar_t>&>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
                *)CONCAT17(in_stack_ffffffffffffffbf,
                           CONCAT16(in_stack_ffffffffffffffbe,
                                    CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8))))
    ;
    if ((in_RDI == in_RSI) || ((*in_RDI != L'}' && (*in_RDI != L':')))) {
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int>_&,_wchar_t>
      ::operator()(in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}